

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::GetTllSignatureTraces(cmTarget *this,ostream *s,TLLSignature sig)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  pointer pcVar4;
  cmState *this_00;
  string *psVar5;
  string local_f0;
  undefined1 local_d0 [8];
  cmListFileContext lfc;
  pair<cmTarget::TLLSignature,_cmListFileContext> *cmd;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
  *__range1;
  undefined1 local_50 [8];
  cmStateDirectory cmDir;
  char *sigString;
  TLLSignature sig_local;
  ostream *s_local;
  cmTarget *this_local;
  
  pcVar2 = "plain";
  if (sig == KeywordTLLSignature) {
    pcVar2 = "keyword";
  }
  cmDir.Snapshot_.Position.Position = (PositionType)pcVar2;
  poVar3 = std::operator<<(s,"The uses of the ");
  poVar3 = std::operator<<(poVar3,(char *)cmDir.Snapshot_.Position.Position);
  std::operator<<(poVar3," signature are here:\n");
  pcVar4 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  cmMakefile::GetStateSnapshot((cmStateSnapshot *)&__range1,pcVar4->Makefile);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_50,(cmStateSnapshot *)&__range1);
  pcVar4 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  __end1 = std::
           vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
           ::begin(&pcVar4->TLLCommands);
  cmd = (pair<cmTarget::TLLSignature,_cmListFileContext> *)
        std::
        vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
        ::end(&pcVar4->TLLCommands);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_*,_std::vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>_>
                                *)&cmd);
    if (!bVar1) break;
    lfc.Line = (long)__gnu_cxx::
                     __normal_iterator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_*,_std::vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>_>
                     ::operator*(&__end1);
    if (((reference)lfc.Line)->first == sig) {
      cmListFileContext::cmListFileContext
                ((cmListFileContext *)local_d0,&((reference)lfc.Line)->second);
      pcVar4 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      this_00 = cmMakefile::GetState(pcVar4->Makefile);
      psVar5 = cmState::GetSourceDirectory_abi_cxx11_(this_00);
      cmStateDirectory::ConvertToRelPathIfNotContained
                (&local_f0,(cmStateDirectory *)local_50,psVar5,
                 (string *)((long)&lfc.Name.field_2 + 8));
      std::__cxx11::string::operator=
                ((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      poVar3 = std::operator<<(s," * ");
      poVar3 = ::operator<<(poVar3,(cmListFileContext *)local_d0);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      cmListFileContext::~cmListFileContext((cmListFileContext *)local_d0);
    }
    __gnu_cxx::
    __normal_iterator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_*,_std::vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmTarget::GetTllSignatureTraces(std::ostream& s, TLLSignature sig) const
{
  const char* sigString =
    (sig == cmTarget::KeywordTLLSignature ? "keyword" : "plain");
  s << "The uses of the " << sigString << " signature are here:\n";
  cmStateDirectory cmDir = impl->Makefile->GetStateSnapshot().GetDirectory();
  for (auto const& cmd : impl->TLLCommands) {
    if (cmd.first == sig) {
      cmListFileContext lfc = cmd.second;
      lfc.FilePath = cmDir.ConvertToRelPathIfNotContained(
        impl->Makefile->GetState()->GetSourceDirectory(), lfc.FilePath);
      s << " * " << lfc << std::endl;
    }
  }
}